

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver.hpp
# Opt level: O2

type __thiscall
nstd::detail::state_saver<test_class_success4_&,_nstd::detail::on_success_policy>::
restore<test_class_success4>
          (state_saver<test_class_success4_&,_nstd::detail::on_success_policy> *this)

{
  test_class_success4::operator=(this->previous_ref_,&this->previous_value_);
  return;
}

Assistant:

auto restore() NEARGYE_NOEXCEPT(std::is_nothrow_assignable<O&, O&>::value) -> typename std::enable_if<std::is_same<T, O>::value && std::is_assignable<O&, O&>::value>::type {
    static_assert(std::is_assignable<O&, O&>::value, "state_saver::restore requires copy operator=.");
#if defined(STATE_SAVER_NO_THROW_RESTORE)
    static_assert(std::is_nothrow_assignable<O&, O&>::value, "state_saver::restore requires noexcept copy operator=.");
#endif
    NEARGYE_TRY
      previous_ref_ = previous_value_;
    NEARGYE_CATCH
  }

  ~state_saver() NEARGYE_NOEXCEPT(std::is_nothrow_assignable<T&, assignable_t>::value) {
    if (policy_.should_execute()) {
      NEARGYE_TRY
        previous_ref_ = static_cast<assignable_t>(previous_value_);
      NEARGYE_CATCH
    }
  }
}